

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::OgreImporter::SetupProperties(OgreImporter *this,Importer *pImp)

{
  bool bVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  Importer *local_18;
  Importer *pImp_local;
  OgreImporter *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Scene.material",&local_59)
  ;
  Importer::GetPropertyString(&local_38,pImp,"IMPORT_OGRE_MATERIAL_FILE",&local_58);
  std::__cxx11::string::operator=((string *)&this->m_userDefinedMaterialLibFile,(string *)&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_OGRE_TEXTURETYPE_FROM_FILENAME",false);
  this->m_detectTextureTypeFromFilename = bVar1;
  return;
}

Assistant:

void OgreImporter::SetupProperties(const Importer* pImp)
{
    m_userDefinedMaterialLibFile = pImp->GetPropertyString(AI_CONFIG_IMPORT_OGRE_MATERIAL_FILE, "Scene.material");
    m_detectTextureTypeFromFilename = pImp->GetPropertyBool(AI_CONFIG_IMPORT_OGRE_TEXTURETYPE_FROM_FILENAME, false);
}